

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_constraint.cpp
# Opt level: O1

unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> __thiscall
duckdb::CheckConstraint::Copy(CheckConstraint *this)

{
  pointer pPVar1;
  CheckConstraint *this_00;
  long in_RSI;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_20;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_18;
  
  pPVar1 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                         *)(in_RSI + 0x10));
  (*(pPVar1->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_20,pPVar1);
  this_00 = (CheckConstraint *)operator_new(0x18);
  local_18._M_head_impl = local_20._M_head_impl;
  local_20._M_head_impl = (ParsedExpression *)0x0;
  CheckConstraint(this_00,(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                           *)&local_18);
  if (local_18._M_head_impl != (ParsedExpression *)0x0) {
    (*((local_18._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  (this->super_Constraint)._vptr_Constraint = (_func_int **)this_00;
  if (local_20._M_head_impl != (ParsedExpression *)0x0) {
    (*((local_20._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  return (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>_>)
         (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>_>)this;
}

Assistant:

unique_ptr<Constraint> CheckConstraint::Copy() const {
	return make_uniq<CheckConstraint>(expression->Copy());
}